

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  uint uVar1;
  stbi__uint16 *psVar2;
  int iVar3;
  stbi__uint16 *psVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long *in_FS_OFFSET;
  undefined1 auVar9 [16];
  
  psVar2 = (stbi__uint16 *)malloc((ulong)(req_comp * x * 8));
  if (psVar2 == (stbi__uint16 *)0x0) {
    free(data);
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
  }
  else {
    if (0 < (int)x) {
      uVar1 = img_n * 8 + 4;
      if ((0x1c < uVar1) || ((0x10101000U >> (uVar1 & 0x1f) & 1) == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                      ,0x737,
                      "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                     );
      }
      iVar3 = req_comp + -1;
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      do {
        if (uVar1 == 0x14) {
          if (-1 < iVar3) {
            lVar8 = 0;
            do {
              auVar9 = pshuflw(ZEXT416(*(uint *)(data + (ulong)uVar5 + lVar8 * 2)),
                               ZEXT416(*(uint *)(data + (ulong)uVar5 + lVar8 * 2)),0x40);
              *(long *)(psVar2 + (ulong)uVar6 + lVar8 * 4) = auVar9._0_8_;
              lVar8 = lVar8 + 1;
            } while (req_comp != (int)lVar8);
          }
        }
        else if (uVar1 == 0x1c) {
          if (-1 < iVar3) {
            psVar4 = data + (uint)((int)uVar7 * req_comp * img_n);
            lVar8 = 0;
            do {
              *(undefined4 *)(psVar2 + (ulong)uVar6 + lVar8 * 4) = *(undefined4 *)psVar4;
              psVar2[(ulong)uVar6 + lVar8 * 4 + 2] = psVar4[2];
              psVar2[(ulong)uVar6 + lVar8 * 4 + 3] = 0xffff;
              lVar8 = lVar8 + 1;
              psVar4 = psVar4 + 3;
            } while (req_comp != (int)lVar8);
          }
        }
        else if (-1 < iVar3) {
          lVar8 = 0;
          do {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = (ulong)data[(ulong)uVar5 + lVar8] | 0xffff0000;
            auVar9 = pshuflw(auVar9,auVar9,0x40);
            *(long *)(psVar2 + (ulong)uVar6 + lVar8 * 4) = auVar9._0_8_;
            lVar8 = lVar8 + 1;
          } while (req_comp != (int)lVar8);
        }
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 + req_comp * 4;
        uVar5 = uVar5 + req_comp * img_n;
      } while (uVar7 != x);
    }
    free(data);
  }
  return psVar2;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}